

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

DescriptorProto_ExtensionRange *
google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>::
New(Arena *arena)

{
  Arena *arena_local;
  DescriptorProto_ExtensionRange *local_28;
  DescriptorProto_ExtensionRange *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (DescriptorProto_ExtensionRange *)operator_new(0x20);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(local_28);
  }
  else {
    local_28 = (DescriptorProto_ExtensionRange *)
               Arena::AllocateAligned
                         (arena,(type_info *)&DescriptorProto_ExtensionRange::typeinfo,0x20);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<google::protobuf::DescriptorProto_ExtensionRange>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }